

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll.cpp
# Opt level: O0

int __thiscall ncnn::BNLL::forward_inplace(BNLL *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  long in_RSI;
  double dVar2;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff78;
  int local_80;
  Mat local_70;
  Mat *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x24);
  local_20 = *(int *)(in_RSI + 0x28);
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = local_1c * local_20;
  for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
    this_00 = &local_70;
    Mat::channel(in_stack_ffffffffffffff78,(int)((ulong)this_00 >> 0x20));
    in_stack_ffffffffffffff78 = (Mat *)Mat::operator_cast_to_float_(this_00);
    Mat::~Mat((Mat *)0x111285);
    local_38 = in_stack_ffffffffffffff78;
    for (local_80 = 0; local_80 < local_28; local_80 = local_80 + 1) {
      if (*(float *)((long)&local_38->data + (long)local_80 * 4) <= 0.0) {
        dVar2 = std::exp((double)(ulong)(uint)*(float *)((long)&local_38->data + (long)local_80 * 4)
                        );
        dVar2 = std::log((double)(ulong)(uint)(SUB84(dVar2,0) + 1.0));
        *(float *)((long)&local_38->data + (long)local_80 * 4) = SUB84(dVar2,0);
      }
      else {
        fVar1 = *(float *)((long)&local_38->data + (long)local_80 * 4);
        dVar2 = std::exp((double)(ulong)(uint)-*(float *)((long)&local_38->data + (long)local_80 * 4
                                                         ));
        dVar2 = std::log((double)(ulong)(uint)(SUB84(dVar2,0) + 1.0));
        *(float *)((long)&local_38->data + (long)local_80 * 4) = fVar1 + SUB84(dVar2,0);
      }
    }
  }
  return 0;
}

Assistant:

int BNLL::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            if (ptr[i] > 0)
                ptr[i] = ptr[i] + log(1.f + exp(-ptr[i]));
            else
                ptr[i] = log(1.f + exp(ptr[i]));
        }
    }

    return 0;
}